

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int __thiscall
fmt::anon_unknown_1::PrecisionHandler::visit_any_int<int>(PrecisionHandler *this,int value)

{
  bool bVar1;
  CStringRef message;
  int in_ESI;
  FormatError *in_stack_ffffffffffffffc8;
  BasicCStringRef<char> local_18;
  int local_c;
  
  local_c = in_ESI;
  bVar1 = IntChecker<true>::fits_in_int(in_ESI);
  if (!bVar1) {
    message.data_ = (char *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_18,"number is too big");
    FormatError::FormatError(in_stack_ffffffffffffffc8,message);
    __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return local_c;
}

Assistant:

int visit_any_int(T value) {
    if (!IntChecker<std::numeric_limits<T>::is_signed>::fits_in_int(value))
      FMT_THROW(FormatError("number is too big"));
    return static_cast<int>(value);
  }